

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp_x86_avx::forward_inplace(BinaryOp_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  _func_int *p_Var2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [32];
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  undefined1 (*pauVar11) [32];
  long lVar12;
  float *pfVar13;
  int iVar14;
  float fVar15;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 uVar29;
  undefined8 uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar37 [64];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float in_register_000012dc;
  __m128 afVar45;
  binary_op_ratan2 op;
  __m128 _b;
  __m256 _b_avx;
  binary_op_ratan2 local_109;
  ulong local_108;
  size_t local_100;
  size_t local_f8;
  ulong local_f0;
  Mat *local_e8;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float local_c0 [2];
  float afStack_b8 [2];
  float afStack_b0 [2];
  float afStack_a8 [6];
  float local_90 [2];
  float afStack_88 [2];
  float local_80 [2];
  float afStack_78 [2];
  float afStack_70 [2];
  float afStack_68 [14];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  
  p_Var2 = this->_vptr_BinaryOp_x86_avx[-3];
  local_e8 = bottom_top_blob;
  switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var2)) {
  case 0:
    fVar15 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->elemsize;
      sVar5 = bottom_top_blob->cstep;
      pauVar11 = (undefined1 (*) [32])(sVar5 * uVar9 * sVar4 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar10; iVar14 = iVar14 + 8) {
        auVar35._0_4_ = fVar15 + *(float *)*pauVar11;
        auVar35._4_4_ = fVar15 + *(float *)((long)*pauVar11 + 4);
        auVar35._8_4_ = fVar15 + *(float *)((long)*pauVar11 + 8);
        auVar35._12_4_ = fVar15 + *(float *)((long)*pauVar11 + 0xc);
        auVar35._16_4_ = fVar15 + *(float *)((long)*pauVar11 + 0x10);
        auVar35._20_4_ = fVar15 + *(float *)((long)*pauVar11 + 0x14);
        auVar35._24_4_ = fVar15 + *(float *)((long)*pauVar11 + 0x18);
        auVar35._28_4_ = fVar15 + *(float *)((long)*pauVar11 + 0x1c);
        *pauVar11 = auVar35;
        pauVar11 = pauVar11 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar10; iVar14 = iVar14 + 4) {
        auVar31._0_4_ = fVar15 + *(float *)*pauVar11;
        auVar31._4_4_ = fVar15 + *(float *)((long)*pauVar11 + 4);
        auVar31._8_4_ = fVar15 + *(float *)((long)*pauVar11 + 8);
        auVar31._12_4_ = fVar15 + *(float *)((long)*pauVar11 + 0xc);
        *(undefined1 (*) [16])*pauVar11 = auVar31;
        pauVar11 = (undefined1 (*) [32])((long)*pauVar11 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar5 * sVar4 * uVar9;
      for (; (int)lVar12 < iVar10; lVar12 = lVar12 + 1) {
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) =
             fVar15 + *(float *)((long)pvVar3 + lVar12 * 4 + lVar7);
      }
    }
    break;
  case 1:
    fVar15 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    auVar19._4_4_ = fVar15;
    auVar19._0_4_ = fVar15;
    auVar19._8_4_ = fVar15;
    auVar19._12_4_ = fVar15;
    auVar24._16_4_ = fVar15;
    auVar24._0_16_ = auVar19;
    auVar24._20_4_ = fVar15;
    auVar24._24_4_ = fVar15;
    auVar24._28_4_ = fVar15;
    iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->elemsize;
      sVar5 = bottom_top_blob->cstep;
      pauVar11 = (undefined1 (*) [32])(sVar5 * uVar9 * sVar4 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar10; iVar14 = iVar14 + 8) {
        auVar26 = vsubps_avx(*pauVar11,auVar24);
        *pauVar11 = auVar26;
        pauVar11 = pauVar11 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar10; iVar14 = iVar14 + 4) {
        auVar21 = vsubps_avx(*(undefined1 (*) [16])*pauVar11,auVar19);
        *(undefined1 (*) [16])*pauVar11 = auVar21;
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar5 * sVar4 * uVar9;
      for (; (int)lVar12 < iVar10; lVar12 = lVar12 + 1) {
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) =
             *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) - fVar15;
      }
    }
    break;
  case 2:
    fVar15 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->elemsize;
      sVar5 = bottom_top_blob->cstep;
      pauVar11 = (undefined1 (*) [32])(sVar5 * uVar9 * sVar4 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar10; iVar14 = iVar14 + 8) {
        auVar37._0_4_ = fVar15 * *(float *)*pauVar11;
        auVar37._4_4_ = fVar15 * *(float *)((long)*pauVar11 + 4);
        auVar37._8_4_ = fVar15 * *(float *)((long)*pauVar11 + 8);
        auVar37._12_4_ = fVar15 * *(float *)((long)*pauVar11 + 0xc);
        auVar37._16_4_ = fVar15 * *(float *)((long)*pauVar11 + 0x10);
        auVar37._20_4_ = fVar15 * *(float *)((long)*pauVar11 + 0x14);
        auVar37._28_36_ = in_ZMM1._28_36_;
        auVar37._24_4_ = fVar15 * *(float *)((long)*pauVar11 + 0x18);
        in_ZMM1 = ZEXT3264(auVar37._0_32_);
        *pauVar11 = auVar37._0_32_;
        pauVar11 = pauVar11 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar10; iVar14 = iVar14 + 4) {
        auVar32._0_4_ = fVar15 * *(float *)*pauVar11;
        auVar32._4_4_ = fVar15 * *(float *)((long)*pauVar11 + 4);
        auVar32._8_4_ = fVar15 * *(float *)((long)*pauVar11 + 8);
        auVar32._12_4_ = fVar15 * *(float *)((long)*pauVar11 + 0xc);
        in_ZMM1 = ZEXT1664(auVar32);
        *(undefined1 (*) [16])*pauVar11 = auVar32;
        pauVar11 = (undefined1 (*) [32])((long)*pauVar11 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar5 * sVar4 * uVar9;
      for (; (int)lVar12 < iVar10; lVar12 = lVar12 + 1) {
        fVar38 = fVar15 * *(float *)((long)pvVar3 + lVar12 * 4 + lVar7);
        in_ZMM1 = ZEXT464((uint)fVar38);
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) = fVar38;
      }
    }
    break;
  case 3:
    iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    auVar17._0_4_ = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var2);
    auVar17._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar21 = vshufps_avx(auVar17,auVar17,0);
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->elemsize;
      sVar5 = bottom_top_blob->cstep;
      pfVar13 = (float *)(sVar5 * uVar9 * sVar4 + (long)pvVar3);
      lVar12 = 0;
      iVar14 = 0;
      while( true ) {
        fVar15 = auVar21._0_4_;
        fVar38 = auVar21._4_4_;
        fVar39 = auVar21._8_4_;
        if (iVar10 <= iVar14 + 7) break;
        *pfVar13 = fVar15 * *pfVar13;
        pfVar13[1] = fVar38 * pfVar13[1];
        pfVar13[2] = fVar39 * pfVar13[2];
        pfVar13[3] = auVar21._12_4_ * pfVar13[3];
        pfVar13[4] = fVar15 * pfVar13[4];
        pfVar13[5] = fVar38 * pfVar13[5];
        pfVar13[6] = fVar39 * pfVar13[6];
        pfVar13[7] = in_register_000012dc;
        pfVar13 = pfVar13 + 8;
        iVar14 = iVar14 + 8;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar10; iVar14 = iVar14 + 4) {
        in_register_000012dc = 0.0;
        *pfVar13 = fVar15 * *pfVar13;
        pfVar13[1] = fVar38 * pfVar13[1];
        pfVar13[2] = fVar39 * pfVar13[2];
        pfVar13[3] = auVar21._12_4_ * pfVar13[3];
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar5 * sVar4 * uVar9;
      for (; (int)lVar12 < iVar10; lVar12 = lVar12 + 1) {
        in_register_000012dc = 0.0;
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) =
             auVar17._0_4_ * *(float *)((long)pvVar3 + lVar12 * 4 + lVar7);
      }
    }
    break;
  case 4:
    uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
    auVar16._4_4_ = uVar1;
    auVar16._0_4_ = uVar1;
    auVar16._8_4_ = uVar1;
    auVar16._12_4_ = uVar1;
    auVar22._16_4_ = uVar1;
    auVar22._0_16_ = auVar16;
    auVar22._20_4_ = uVar1;
    auVar22._24_4_ = uVar1;
    auVar22._28_4_ = uVar1;
    iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->elemsize;
      sVar5 = bottom_top_blob->cstep;
      pauVar11 = (undefined1 (*) [32])(sVar5 * uVar9 * sVar4 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar10; iVar14 = iVar14 + 8) {
        auVar26 = vmaxps_avx(auVar22,*pauVar11);
        *pauVar11 = auVar26;
        pauVar11 = pauVar11 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar10; iVar14 = iVar14 + 4) {
        auVar21 = vmaxps_avx(auVar16,*(undefined1 (*) [16])*pauVar11);
        *(undefined1 (*) [16])*pauVar11 = auVar21;
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar5 * sVar4 * uVar9;
      for (; (int)lVar12 < iVar10; lVar12 = lVar12 + 1) {
        auVar21 = vmaxss_avx(auVar16,ZEXT416(*(uint *)((long)pvVar3 + lVar12 * 4 + lVar7)));
        *(int *)((long)pvVar3 + lVar12 * 4 + lVar7) = auVar21._0_4_;
      }
    }
    break;
  case 5:
    uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
    auVar20._4_4_ = uVar1;
    auVar20._0_4_ = uVar1;
    auVar20._8_4_ = uVar1;
    auVar20._12_4_ = uVar1;
    auVar25._16_4_ = uVar1;
    auVar25._0_16_ = auVar20;
    auVar25._20_4_ = uVar1;
    auVar25._24_4_ = uVar1;
    auVar25._28_4_ = uVar1;
    iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->elemsize;
      sVar5 = bottom_top_blob->cstep;
      pauVar11 = (undefined1 (*) [32])(sVar5 * uVar9 * sVar4 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar10; iVar14 = iVar14 + 8) {
        auVar26 = vminps_avx(auVar25,*pauVar11);
        *pauVar11 = auVar26;
        pauVar11 = pauVar11 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar10; iVar14 = iVar14 + 4) {
        auVar21 = vminps_avx(auVar20,*(undefined1 (*) [16])*pauVar11);
        *(undefined1 (*) [16])*pauVar11 = auVar21;
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar5 * sVar4 * uVar9;
      for (; (int)lVar12 < iVar10; lVar12 = lVar12 + 1) {
        auVar21 = vminss_avx(auVar20,ZEXT416(*(uint *)((long)pvVar3 + lVar12 * 4 + lVar7)));
        *(int *)((long)pvVar3 + lVar12 * 4 + lVar7) = auVar21._0_4_;
      }
    }
    break;
  case 6:
    local_e0 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_f0 = 0;
    local_108 = (ulong)(uint)bottom_top_blob->c;
    fStack_dc = local_e0;
    fStack_d8 = local_e0;
    fStack_d4 = local_e0;
    fStack_d0 = local_e0;
    fStack_cc = local_e0;
    fStack_c8 = local_e0;
    fStack_c4 = local_e0;
    if (bottom_top_blob->c < 1) {
      local_108 = local_f0;
    }
    while (local_f0 != local_108) {
      pvVar3 = bottom_top_blob->data;
      local_100 = bottom_top_blob->elemsize;
      local_f8 = bottom_top_blob->cstep;
      pfVar13 = (float *)(local_f8 * local_f0 * local_100 + (long)pvVar3);
      local_80[1] = fStack_dc;
      local_80[0] = local_e0;
      afStack_78[1] = fStack_d4;
      afStack_78[0] = fStack_d8;
      afStack_70[1] = fStack_cc;
      afStack_70[0] = fStack_d0;
      afStack_68[1] = fStack_c4;
      afStack_68[0] = fStack_c8;
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar10; iVar14 = iVar14 + 8) {
        uVar28 = *(undefined8 *)pfVar13;
        uVar27 = *(undefined8 *)(pfVar13 + 2);
        uVar29 = *(undefined8 *)(pfVar13 + 4);
        uVar30 = *(undefined8 *)(pfVar13 + 6);
        local_c0 = (float  [2])uVar28;
        afStack_b8 = (float  [2])uVar27;
        afStack_b0 = (float  [2])uVar29;
        afStack_a8._0_8_ = uVar30;
        BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                  ((binary_op_pow *)&local_109,(__m256 *)local_c0,(__m256 *)local_80);
        *(undefined8 *)pfVar13 = uVar28;
        *(undefined8 *)(pfVar13 + 2) = uVar27;
        *(undefined8 *)(pfVar13 + 4) = uVar29;
        *(undefined8 *)(pfVar13 + 6) = uVar30;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
      }
      local_c0[1] = fStack_dc;
      local_c0[0] = local_e0;
      afStack_b8[1] = fStack_d4;
      afStack_b8[0] = fStack_d8;
      for (; bottom_top_blob = local_e8, uVar8 = local_f0, iVar14 + 3 < iVar10; iVar14 = iVar14 + 4)
      {
        local_90 = *(float (*) [2])pfVar13;
        uVar28 = *(undefined8 *)(pfVar13 + 2);
        afStack_88 = (float  [2])uVar28;
        afVar45 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                            ((binary_op_pow *)&local_109,(__m128 *)local_90,(__m128 *)local_c0);
        *(long *)pfVar13 = afVar45._0_8_;
        *(undefined8 *)(pfVar13 + 2) = uVar28;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = local_f8 * local_100 * local_f0;
      for (; (int)lVar12 < iVar10; lVar12 = lVar12 + 1) {
        fVar15 = powf(*(float *)((long)pvVar3 + lVar12 * 4 + lVar7),local_e0);
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) = fVar15;
      }
      local_f0 = uVar8 + 1;
    }
    break;
  case 7:
    fVar15 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    auVar18._4_4_ = fVar15;
    auVar18._0_4_ = fVar15;
    auVar18._8_4_ = fVar15;
    auVar18._12_4_ = fVar15;
    auVar23._16_4_ = fVar15;
    auVar23._0_16_ = auVar18;
    auVar23._20_4_ = fVar15;
    auVar23._24_4_ = fVar15;
    auVar23._28_4_ = fVar15;
    iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->elemsize;
      sVar5 = bottom_top_blob->cstep;
      pauVar11 = (undefined1 (*) [32])(sVar5 * uVar9 * sVar4 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar10; iVar14 = iVar14 + 8) {
        auVar26 = vsubps_avx(auVar23,*pauVar11);
        *pauVar11 = auVar26;
        pauVar11 = pauVar11 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar10; iVar14 = iVar14 + 4) {
        auVar21 = vsubps_avx(auVar18,*(undefined1 (*) [16])*pauVar11);
        *(undefined1 (*) [16])*pauVar11 = auVar21;
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar5 * sVar4 * uVar9;
      for (; (int)lVar12 < iVar10; lVar12 = lVar12 + 1) {
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) =
             fVar15 - *(float *)((long)pvVar3 + lVar12 * 4 + lVar7);
      }
    }
    break;
  case 8:
    fVar15 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    auVar21._4_4_ = fVar15;
    auVar21._0_4_ = fVar15;
    auVar21._8_4_ = fVar15;
    auVar21._12_4_ = fVar15;
    auVar26._16_4_ = fVar15;
    auVar26._0_16_ = auVar21;
    auVar26._20_4_ = fVar15;
    auVar26._24_4_ = fVar15;
    auVar26._28_4_ = fVar15;
    iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->elemsize;
      sVar5 = bottom_top_blob->cstep;
      pauVar11 = (undefined1 (*) [32])(sVar5 * uVar9 * sVar4 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar10; iVar14 = iVar14 + 8) {
        auVar23 = *pauVar11;
        auVar25 = vrcpps_avx(auVar23);
        fVar38 = fVar15 * auVar25._0_4_;
        fVar39 = fVar15 * auVar25._4_4_;
        fVar40 = fVar15 * auVar25._8_4_;
        fVar41 = fVar15 * auVar25._12_4_;
        fVar42 = fVar15 * auVar25._16_4_;
        fVar43 = fVar15 * auVar25._20_4_;
        fVar44 = fVar15 * auVar25._24_4_;
        auVar6._4_4_ = auVar23._4_4_ * fVar39;
        auVar6._0_4_ = auVar23._0_4_ * fVar38;
        auVar6._8_4_ = auVar23._8_4_ * fVar40;
        auVar6._12_4_ = auVar23._12_4_ * fVar41;
        auVar6._16_4_ = auVar23._16_4_ * fVar42;
        auVar6._20_4_ = auVar23._20_4_ * fVar43;
        auVar6._24_4_ = auVar23._24_4_ * fVar44;
        auVar6._28_4_ = auVar23._28_4_;
        auVar23 = vsubps_avx(auVar26,auVar6);
        auVar36._0_4_ = fVar38 + auVar25._0_4_ * auVar23._0_4_;
        auVar36._4_4_ = fVar39 + auVar25._4_4_ * auVar23._4_4_;
        auVar36._8_4_ = fVar40 + auVar25._8_4_ * auVar23._8_4_;
        auVar36._12_4_ = fVar41 + auVar25._12_4_ * auVar23._12_4_;
        auVar36._16_4_ = fVar42 + auVar25._16_4_ * auVar23._16_4_;
        auVar36._20_4_ = fVar43 + auVar25._20_4_ * auVar23._20_4_;
        auVar36._24_4_ = fVar44 + auVar25._24_4_ * auVar23._24_4_;
        auVar36._28_4_ = in_register_000012dc + auVar23._28_4_;
        *pauVar11 = auVar36;
        pauVar11 = pauVar11 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar10; iVar14 = iVar14 + 4) {
        auVar18 = *(undefined1 (*) [16])*pauVar11;
        auVar20 = vrcpps_avx(auVar18);
        fVar38 = fVar15 * auVar20._0_4_;
        fVar39 = fVar15 * auVar20._4_4_;
        fVar40 = fVar15 * auVar20._8_4_;
        fVar41 = fVar15 * auVar20._12_4_;
        in_register_000012dc = 0.0;
        auVar33._0_4_ = auVar18._0_4_ * fVar38;
        auVar33._4_4_ = auVar18._4_4_ * fVar39;
        auVar33._8_4_ = auVar18._8_4_ * fVar40;
        auVar33._12_4_ = auVar18._12_4_ * fVar41;
        auVar18 = vsubps_avx(auVar21,auVar33);
        auVar34._0_4_ = fVar38 + auVar20._0_4_ * auVar18._0_4_;
        auVar34._4_4_ = fVar39 + auVar20._4_4_ * auVar18._4_4_;
        auVar34._8_4_ = fVar40 + auVar20._8_4_ * auVar18._8_4_;
        auVar34._12_4_ = fVar41 + auVar20._12_4_ * auVar18._12_4_;
        *(undefined1 (*) [16])*pauVar11 = auVar34;
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar5 * sVar4 * uVar9;
      for (; (int)lVar12 < iVar10; lVar12 = lVar12 + 1) {
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) =
             fVar15 / *(float *)((long)pvVar3 + lVar12 * 4 + lVar7);
      }
    }
    break;
  case 9:
    local_e0 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_f0 = 0;
    local_108 = (ulong)(uint)bottom_top_blob->c;
    fStack_dc = local_e0;
    fStack_d8 = local_e0;
    fStack_d4 = local_e0;
    fStack_d0 = local_e0;
    fStack_cc = local_e0;
    fStack_c8 = local_e0;
    fStack_c4 = local_e0;
    if (bottom_top_blob->c < 1) {
      local_108 = local_f0;
    }
    while (local_f0 != local_108) {
      pvVar3 = bottom_top_blob->data;
      local_100 = bottom_top_blob->elemsize;
      local_f8 = bottom_top_blob->cstep;
      pfVar13 = (float *)(local_f8 * local_f0 * local_100 + (long)pvVar3);
      local_80[1] = fStack_dc;
      local_80[0] = local_e0;
      afStack_78[1] = fStack_d4;
      afStack_78[0] = fStack_d8;
      afStack_70[1] = fStack_cc;
      afStack_70[0] = fStack_d0;
      afStack_68[1] = fStack_c4;
      afStack_68[0] = fStack_c8;
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar10; iVar14 = iVar14 + 8) {
        uVar28 = *(undefined8 *)pfVar13;
        uVar27 = *(undefined8 *)(pfVar13 + 2);
        uVar29 = *(undefined8 *)(pfVar13 + 4);
        uVar30 = *(undefined8 *)(pfVar13 + 6);
        local_c0 = (float  [2])uVar28;
        afStack_b8 = (float  [2])uVar27;
        afStack_b0 = (float  [2])uVar29;
        afStack_a8._0_8_ = uVar30;
        BinaryOp_x86_avx_functor::binary_op_rpow::func_pack8
                  ((binary_op_rpow *)&local_109,(__m256 *)local_c0,(__m256 *)local_80);
        *(undefined8 *)pfVar13 = uVar28;
        *(undefined8 *)(pfVar13 + 2) = uVar27;
        *(undefined8 *)(pfVar13 + 4) = uVar29;
        *(undefined8 *)(pfVar13 + 6) = uVar30;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
      }
      local_c0[1] = fStack_dc;
      local_c0[0] = local_e0;
      afStack_b8[1] = fStack_d4;
      afStack_b8[0] = fStack_d8;
      for (; bottom_top_blob = local_e8, uVar8 = local_f0, iVar14 + 3 < iVar10; iVar14 = iVar14 + 4)
      {
        local_90 = *(float (*) [2])pfVar13;
        uVar28 = *(undefined8 *)(pfVar13 + 2);
        afStack_88 = (float  [2])uVar28;
        afVar45 = BinaryOp_x86_avx_functor::binary_op_rpow::func_pack4
                            ((binary_op_rpow *)&local_109,(__m128 *)local_90,(__m128 *)local_c0);
        *(long *)pfVar13 = afVar45._0_8_;
        *(undefined8 *)(pfVar13 + 2) = uVar28;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = local_f8 * local_100 * local_f0;
      for (; (int)lVar12 < iVar10; lVar12 = lVar12 + 1) {
        fVar15 = powf(local_e0,*(float *)((long)pvVar3 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) = fVar15;
      }
      local_f0 = uVar8 + 1;
    }
    break;
  case 10:
    local_e0 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_f0 = 0;
    local_108 = (ulong)(uint)bottom_top_blob->c;
    fStack_dc = local_e0;
    fStack_d8 = local_e0;
    fStack_d4 = local_e0;
    fStack_d0 = local_e0;
    fStack_cc = local_e0;
    fStack_c8 = local_e0;
    fStack_c4 = local_e0;
    if (bottom_top_blob->c < 1) {
      local_108 = local_f0;
    }
    while (local_f0 != local_108) {
      pvVar3 = bottom_top_blob->data;
      local_100 = bottom_top_blob->elemsize;
      local_f8 = bottom_top_blob->cstep;
      pfVar13 = (float *)(local_f8 * local_f0 * local_100 + (long)pvVar3);
      local_80[1] = fStack_dc;
      local_80[0] = local_e0;
      afStack_78[1] = fStack_d4;
      afStack_78[0] = fStack_d8;
      afStack_70[1] = fStack_cc;
      afStack_70[0] = fStack_d0;
      afStack_68[1] = fStack_c4;
      afStack_68[0] = fStack_c8;
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar10; iVar14 = iVar14 + 8) {
        uVar28 = *(undefined8 *)pfVar13;
        uVar27 = *(undefined8 *)(pfVar13 + 2);
        uVar29 = *(undefined8 *)(pfVar13 + 4);
        uVar30 = *(undefined8 *)(pfVar13 + 6);
        local_c0 = (float  [2])uVar28;
        afStack_b8 = (float  [2])uVar27;
        afStack_b0 = (float  [2])uVar29;
        afStack_a8._0_8_ = uVar30;
        BinaryOp_x86_avx_functor::binary_op_atan2::func_pack8
                  ((binary_op_atan2 *)&local_109,(__m256 *)local_c0,(__m256 *)local_80);
        *(undefined8 *)pfVar13 = uVar28;
        *(undefined8 *)(pfVar13 + 2) = uVar27;
        *(undefined8 *)(pfVar13 + 4) = uVar29;
        *(undefined8 *)(pfVar13 + 6) = uVar30;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
      }
      local_c0[1] = fStack_dc;
      local_c0[0] = local_e0;
      afStack_b8[1] = fStack_d4;
      afStack_b8[0] = fStack_d8;
      for (; bottom_top_blob = local_e8, uVar8 = local_f0, iVar14 + 3 < iVar10; iVar14 = iVar14 + 4)
      {
        local_90 = *(float (*) [2])pfVar13;
        uVar28 = *(undefined8 *)(pfVar13 + 2);
        afStack_88 = (float  [2])uVar28;
        afVar45 = BinaryOp_x86_avx_functor::binary_op_atan2::func_pack4
                            ((binary_op_atan2 *)&local_109,(__m128 *)local_90,(__m128 *)local_c0);
        *(long *)pfVar13 = afVar45._0_8_;
        *(undefined8 *)(pfVar13 + 2) = uVar28;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = local_f8 * local_100 * local_f0;
      for (; (int)lVar12 < iVar10; lVar12 = lVar12 + 1) {
        fVar15 = atan2f(*(float *)((long)pvVar3 + lVar12 * 4 + lVar7),local_e0);
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) = fVar15;
      }
      local_f0 = uVar8 + 1;
    }
    break;
  case 0xb:
    local_e0 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_f0 = 0;
    local_108 = (ulong)(uint)bottom_top_blob->c;
    fStack_dc = local_e0;
    fStack_d8 = local_e0;
    fStack_d4 = local_e0;
    fStack_d0 = local_e0;
    fStack_cc = local_e0;
    fStack_c8 = local_e0;
    fStack_c4 = local_e0;
    if (bottom_top_blob->c < 1) {
      local_108 = local_f0;
    }
    while (local_f0 != local_108) {
      pvVar3 = bottom_top_blob->data;
      local_100 = bottom_top_blob->elemsize;
      local_f8 = bottom_top_blob->cstep;
      pfVar13 = (float *)(local_f8 * local_f0 * local_100 + (long)pvVar3);
      local_80[1] = fStack_dc;
      local_80[0] = local_e0;
      afStack_78[1] = fStack_d4;
      afStack_78[0] = fStack_d8;
      afStack_70[1] = fStack_cc;
      afStack_70[0] = fStack_d0;
      afStack_68[1] = fStack_c4;
      afStack_68[0] = fStack_c8;
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar10; iVar14 = iVar14 + 8) {
        uVar28 = *(undefined8 *)pfVar13;
        uVar27 = *(undefined8 *)(pfVar13 + 2);
        uVar29 = *(undefined8 *)(pfVar13 + 4);
        uVar30 = *(undefined8 *)(pfVar13 + 6);
        local_c0 = (float  [2])uVar28;
        afStack_b8 = (float  [2])uVar27;
        afStack_b0 = (float  [2])uVar29;
        afStack_a8._0_8_ = uVar30;
        BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack8
                  (&local_109,(__m256 *)local_c0,(__m256 *)local_80);
        *(undefined8 *)pfVar13 = uVar28;
        *(undefined8 *)(pfVar13 + 2) = uVar27;
        *(undefined8 *)(pfVar13 + 4) = uVar29;
        *(undefined8 *)(pfVar13 + 6) = uVar30;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
      }
      local_c0[1] = fStack_dc;
      local_c0[0] = local_e0;
      afStack_b8[1] = fStack_d4;
      afStack_b8[0] = fStack_d8;
      for (; bottom_top_blob = local_e8, uVar8 = local_f0, iVar14 + 3 < iVar10; iVar14 = iVar14 + 4)
      {
        local_90 = *(float (*) [2])pfVar13;
        uVar28 = *(undefined8 *)(pfVar13 + 2);
        afStack_88 = (float  [2])uVar28;
        afVar45 = BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack4
                            (&local_109,(__m128 *)local_90,(__m128 *)local_c0);
        *(long *)pfVar13 = afVar45._0_8_;
        *(undefined8 *)(pfVar13 + 2) = uVar28;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = local_f8 * local_100 * local_f0;
      for (; (int)lVar12 < iVar10; lVar12 = lVar12 + 1) {
        fVar15 = atan2f(local_e0,*(float *)((long)pvVar3 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) = fVar15;
      }
      local_f0 = uVar8 + 1;
    }
  }
  return 0;
}

Assistant:

int BinaryOp_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace BinaryOp_x86_avx_functor;

    if (op_type == Operation_ADD) return binary_op_scalar_inplace<binary_op_add>(bottom_top_blob, b, opt);
    if (op_type == Operation_SUB) return binary_op_scalar_inplace<binary_op_sub>(bottom_top_blob, b, opt);
    if (op_type == Operation_MUL) return binary_op_scalar_inplace<binary_op_mul>(bottom_top_blob, b, opt);
    if (op_type == Operation_DIV) return binary_op_scalar_inplace<binary_op_div>(bottom_top_blob, b, opt);
    if (op_type == Operation_MAX) return binary_op_scalar_inplace<binary_op_max>(bottom_top_blob, b, opt);
    if (op_type == Operation_MIN) return binary_op_scalar_inplace<binary_op_min>(bottom_top_blob, b, opt);
    if (op_type == Operation_POW) return binary_op_scalar_inplace<binary_op_pow>(bottom_top_blob, b, opt);
    if (op_type == Operation_RSUB) return binary_op_scalar_inplace<binary_op_rsub>(bottom_top_blob, b, opt);
    if (op_type == Operation_RDIV) return binary_op_scalar_inplace<binary_op_rdiv>(bottom_top_blob, b, opt);
    if (op_type == Operation_RPOW) return binary_op_scalar_inplace<binary_op_rpow>(bottom_top_blob, b, opt);
    if (op_type == Operation_ATAN2) return binary_op_scalar_inplace<binary_op_atan2>(bottom_top_blob, b, opt);
    if (op_type == Operation_RATAN2) return binary_op_scalar_inplace<binary_op_ratan2>(bottom_top_blob, b, opt);

    return 0;
}